

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

void __thiscall ON_Brep::FlipLoop(ON_Brep *this,ON_BrepLoop *loop)

{
  int i;
  int iVar1;
  int iVar2;
  int *piVar3;
  ON_BrepTrim *pOVar4;
  int loop_trim_count;
  int brep_trim_count;
  int lti;
  int ti;
  ON_BrepLoop *loop_local;
  ON_Brep *this_local;
  
  iVar1 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
  iVar2 = ON_SimpleArray<int>::Count(&loop->m_ti);
  ON_SimpleArray<int>::Reverse(&loop->m_ti);
  for (loop_trim_count = 0; loop_trim_count < iVar2; loop_trim_count = loop_trim_count + 1) {
    piVar3 = ON_SimpleArray<int>::operator[](&loop->m_ti,loop_trim_count);
    i = *piVar3;
    if ((-1 < i) && (i < iVar1)) {
      pOVar4 = ON_ClassArray<ON_BrepTrim>::operator[]((ON_ClassArray<ON_BrepTrim> *)&this->m_T,i);
      (*(pOVar4->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[0x38])();
    }
  }
  return;
}

Assistant:

void 
ON_Brep::FlipLoop(ON_BrepLoop& loop)
{
  int ti, lti;
  const int brep_trim_count = m_T.Count();
  const int loop_trim_count = loop.m_ti.Count();

  // reverse order of trimming curves
  loop.m_ti.Reverse();
  // reverse direction of individual trimming curves
  for ( lti = 0; lti < loop_trim_count; lti++ ) 
  {
    ti = loop.m_ti[lti];
    if ( ti >= 0 && ti < brep_trim_count ) 
    {
      m_T[ti].Reverse();
    }
  }
}